

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_inter_pred_filters_ssse3_intr.c
# Opt level: O2

void ihevc_inter_pred_luma_copy_ssse3
               (UWORD8 *pu1_src,UWORD8 *pu1_dst,WORD32 src_strd,WORD32 dst_strd,WORD8 *pi1_coeff,
               WORD32 ht,WORD32 wd)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  long lVar11;
  long lVar12;
  int iVar13;
  long lVar14;
  
  if ((wd & 3U) != 0) {
    __assert_fail("(wd % 4 == 0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Zhziyao[P]libhevctest/common/x86/ihevc_inter_pred_filters_ssse3_intr.c"
                  ,0x82,
                  "void ihevc_inter_pred_luma_copy_ssse3(UWORD8 *, UWORD8 *, WORD32, WORD32, WORD8 *, WORD32, WORD32)"
                 );
  }
  if ((ht & 3U) == 0) {
    if ((wd & 0xcU) == 0) {
      for (iVar13 = 0; iVar13 < ht; iVar13 = iVar13 + 4) {
        for (lVar11 = 0; (int)lVar11 < wd; lVar11 = lVar11 + 0x10) {
          uVar4 = *(undefined8 *)(pu1_src + lVar11 + 8);
          uVar5 = *(undefined8 *)(pu1_src + lVar11 + src_strd);
          uVar6 = *(undefined8 *)(pu1_src + lVar11 + src_strd + 8);
          uVar7 = *(undefined8 *)(pu1_src + lVar11 + src_strd * 2);
          uVar8 = *(undefined8 *)(pu1_src + lVar11 + src_strd * 2 + 8);
          uVar9 = *(undefined8 *)(pu1_src + lVar11 + src_strd * 3);
          uVar10 = *(undefined8 *)(pu1_src + lVar11 + src_strd * 3 + 8);
          *(undefined8 *)(pu1_dst + lVar11) = *(undefined8 *)(pu1_src + lVar11);
          *(undefined8 *)(pu1_dst + lVar11 + 8) = uVar4;
          *(undefined8 *)(pu1_dst + lVar11 + dst_strd) = uVar5;
          *(undefined8 *)(pu1_dst + lVar11 + dst_strd + 8) = uVar6;
          *(undefined8 *)(pu1_dst + lVar11 + dst_strd * 2) = uVar7;
          *(undefined8 *)(pu1_dst + lVar11 + dst_strd * 2 + 8) = uVar8;
          *(undefined8 *)(pu1_dst + lVar11 + dst_strd * 3) = uVar9;
          *(undefined8 *)(pu1_dst + lVar11 + dst_strd * 3 + 8) = uVar10;
        }
        pu1_src = pu1_src + lVar11 + (src_strd * 4 - wd);
        pu1_dst = pu1_dst + lVar11 + (dst_strd * 4 - wd);
      }
    }
    else {
      lVar11 = (long)(src_strd * 4 - wd);
      lVar12 = (long)(dst_strd * 4 - wd);
      iVar13 = 0;
      if ((wd & 4U) == 0) {
        for (; iVar13 < ht; iVar13 = iVar13 + 4) {
          for (lVar14 = 0; (int)lVar14 < wd; lVar14 = lVar14 + 8) {
            uVar4 = *(undefined8 *)(pu1_src + lVar14 + src_strd);
            uVar5 = *(undefined8 *)(pu1_src + lVar14 + src_strd * 2);
            uVar6 = *(undefined8 *)(pu1_src + lVar14 + src_strd * 3);
            *(undefined8 *)(pu1_dst + lVar14) = *(undefined8 *)(pu1_src + lVar14);
            *(undefined8 *)(pu1_dst + lVar14 + dst_strd) = uVar4;
            *(undefined8 *)(pu1_dst + lVar14 + dst_strd * 2) = uVar5;
            *(undefined8 *)(pu1_dst + lVar14 + dst_strd * 3) = uVar6;
          }
          pu1_src = pu1_src + lVar14 + lVar11;
          pu1_dst = pu1_dst + lVar14 + lVar12;
        }
      }
      else {
        for (; iVar13 < ht; iVar13 = iVar13 + 4) {
          for (lVar14 = 0; (int)lVar14 < wd; lVar14 = lVar14 + 4) {
            uVar1 = *(undefined4 *)(pu1_src + lVar14 + src_strd);
            uVar2 = *(undefined4 *)(pu1_src + lVar14 + src_strd * 2);
            uVar3 = *(undefined4 *)(pu1_src + lVar14 + src_strd * 3);
            *(undefined4 *)(pu1_dst + lVar14) = *(undefined4 *)(pu1_src + lVar14);
            *(undefined4 *)(pu1_dst + lVar14 + dst_strd) = uVar1;
            *(undefined4 *)(pu1_dst + lVar14 + dst_strd * 2) = uVar2;
            *(undefined4 *)(pu1_dst + lVar14 + dst_strd * 3) = uVar3;
          }
          pu1_src = pu1_src + lVar14 + lVar11;
          pu1_dst = pu1_dst + lVar14 + lVar12;
        }
      }
    }
    return;
  }
  __assert_fail("(ht % 4 == 0)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Zhziyao[P]libhevctest/common/x86/ihevc_inter_pred_filters_ssse3_intr.c"
                ,0x83,
                "void ihevc_inter_pred_luma_copy_ssse3(UWORD8 *, UWORD8 *, WORD32, WORD32, WORD8 *, WORD32, WORD32)"
               );
}

Assistant:

void ihevc_inter_pred_luma_copy_ssse3(UWORD8 *pu1_src,
                                      UWORD8 *pu1_dst,
                                      WORD32 src_strd,
                                      WORD32 dst_strd,
                                      WORD8 *pi1_coeff,
                                      WORD32 ht,
                                      WORD32 wd)
{

    WORD32 row, col;
    __m128i  src0_16x8b, src1_16x8b, src2_16x8b, src3_16x8b;
    UNUSED(pi1_coeff);
    ASSERT(wd % 4 == 0); /* checking assumption*/
    ASSERT(ht % 4 == 0); /* checking assumption*/

/*  outer for loop starts from here */
    if(0 == (wd & 15)) /* wd multiple of 16 case */
    {
        for(row = 0; row < ht; row += 4)
        {
            for(col = 0; col < wd; col += 16)
            {
                /*load 16 pixel values from 15:0 pos. relative to cur. pos.*/
                src0_16x8b = _mm_loadu_si128((__m128i *)(pu1_src));                /* row =0 */
                src1_16x8b = _mm_loadu_si128((__m128i *)(pu1_src + 1 * src_strd)); /* row =1 */
                src2_16x8b = _mm_loadu_si128((__m128i *)(pu1_src + 2 * src_strd)); /* row =2 */
                src3_16x8b = _mm_loadu_si128((__m128i *)(pu1_src + 3 * src_strd)); /* row =3 */

                /* storing 16 8-bit output values */
                _mm_storeu_si128((__m128i *)(pu1_dst), src0_16x8b);                 /* row =0 */
                _mm_storeu_si128((__m128i *)(pu1_dst + 1 * dst_strd), src1_16x8b);  /* row =1 */
                _mm_storeu_si128((__m128i *)(pu1_dst + 2 * dst_strd), src2_16x8b);  /* row =2 */
                _mm_storeu_si128((__m128i *)(pu1_dst + 3 * dst_strd), src3_16x8b);  /* row =3 */

                pu1_src += 16; /* pointer update */
                pu1_dst += 16; /* pointer update */
            } /* inner for loop ends here(16-output values in single iteration) */

            pu1_src += 4 * src_strd - wd; /* pointer update */
            pu1_dst += 4 * dst_strd - wd; /* pointer update */
        }

    }
    else if(0 == (wd & 7)) /* multiple of 8 case */
    {
        for(row = 0; row < ht; row += 4)
        {
            for(col = 0; col < wd; col += 8)
            {
                /*load 16 pixel values from 15:0 pos. relative to cur. pos.*/
                src0_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src));                /* row =0 */
                src1_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src + 1 * src_strd)); /* row =1 */
                src2_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src + 2 * src_strd)); /* row =2 */
                src3_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src + 3 * src_strd)); /* row =3 */

                /* storing 16 8-bit output values */
                _mm_storel_epi64((__m128i *)(pu1_dst), src0_16x8b);                 /* row =0 */
                _mm_storel_epi64((__m128i *)(pu1_dst + 1 * dst_strd), src1_16x8b);  /* row =1 */
                _mm_storel_epi64((__m128i *)(pu1_dst + 2 * dst_strd), src2_16x8b);  /* row =2 */
                _mm_storel_epi64((__m128i *)(pu1_dst + 3 * dst_strd), src3_16x8b);  /* row =3 */

                pu1_src += 8; /* pointer update */
                pu1_dst += 8; /* pointer update */
            } /*  inner for loop ends here(8-output values in single iteration) */

            pu1_src += 4 * src_strd - wd; /* pointer update */
            pu1_dst += 4 * dst_strd - wd; /* pointer update */
        }
    }
    else /* wd = multiple of 4 case */
    {
        WORD32 dst0, dst1, dst2, dst3;
        for(row = 0; row < ht; row += 4)
        {
            for(col = 0; col < wd; col += 4)
            {
                /*load 16 pixel values from 15:0 pos. relative to cur. pos.*/
                src0_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src));                /* row =0 */
                src1_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src + 1 * src_strd)); /* row =1 */
                src2_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src + 2 * src_strd)); /* row =2 */
                src3_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src + 3 * src_strd)); /* row =3 */

                dst0 = _mm_cvtsi128_si32(src0_16x8b);
                dst1 = _mm_cvtsi128_si32(src1_16x8b);
                dst2 = _mm_cvtsi128_si32(src2_16x8b);
                dst3 = _mm_cvtsi128_si32(src3_16x8b);

                /* storing 4 8-bit output values */
                *(WORD32 *)(&pu1_dst[0 * dst_strd]) = dst0; /* row =0 */
                *(WORD32 *)(&pu1_dst[1 * dst_strd]) = dst1; /* row =1 */
                *(WORD32 *)(&pu1_dst[2 * dst_strd]) = dst2; /* row =2 */
                *(WORD32 *)(&pu1_dst[3 * dst_strd]) = dst3; /* row =3 */

                pu1_src += 4; /* pointer update */
                pu1_dst += 4; /* pointer update */
            } /*  inner for loop ends here(4- output values in single iteration) */

            pu1_src += 4 * src_strd - wd; /* pointer update */
            pu1_dst += 4 * dst_strd - wd; /* pointer update */
        }
    }
}